

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# indexgenerator.cpp
# Opt level: O2

unsigned_long_long *
meshopt::hashLookup<unsigned_long_long,meshopt::EdgeHasher>
          (unsigned_long_long *table,size_t buckets,EdgeHasher *hash,unsigned_long_long *key,
          unsigned_long_long *empty)

{
  bool bVar1;
  size_t sVar2;
  size_t probe;
  ulong uVar3;
  ulong uVar4;
  
  sVar2 = EdgeHasher::hash(hash,*key);
  uVar3 = 0;
  while( true ) {
    if (buckets - 1 < uVar3) {
      return (unsigned_long_long *)0x0;
    }
    uVar4 = sVar2 & buckets - 1;
    if ((table[uVar4] == *empty) || (bVar1 = EdgeHasher::equal(hash,table[uVar4],*key), bVar1))
    break;
    sVar2 = uVar4 + uVar3 + 1;
    uVar3 = uVar3 + 1;
  }
  return table + uVar4;
}

Assistant:

static T* hashLookup(T* table, size_t buckets, const Hash& hash, const T& key, const T& empty)
{
	assert(buckets > 0);
	assert((buckets & (buckets - 1)) == 0);

	size_t hashmod = buckets - 1;
	size_t bucket = hash.hash(key) & hashmod;

	for (size_t probe = 0; probe <= hashmod; ++probe)
	{
		T& item = table[bucket];

		if (item == empty)
			return &item;

		if (hash.equal(item, key))
			return &item;

		// hash collision, quadratic probing
		bucket = (bucket + probe + 1) & hashmod;
	}

	assert(false && "Hash table is full"); // unreachable
	return 0;
}